

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,duckdb::uhugeint_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  value_type vVar5;
  sel_t *psVar6;
  const_reference pvVar7;
  uint uVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  uchar **rhs_locations;
  data_ptr_t pdVar12;
  idx_t iVar13;
  bool bVar14;
  SelectionVector *lhs_sel;
  uhugeint_t local_48;
  data_ptr_t local_38;
  
  puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar3 = (lhs_format->unified).sel;
  pdVar4 = (lhs_format->unified).data;
  pdVar12 = rhs_row_locations->data;
  pvVar7 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar5 = *pvVar7;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar13 = 0;
      iVar10 = 0;
      do {
        iVar9 = iVar10;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar9 = (idx_t)sel->sel_vector[iVar10];
        }
        psVar6 = pSVar3->sel_vector;
        iVar11 = iVar9;
        if (psVar6 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar6[iVar9];
        }
        puVar1 = (uint64_t *)(*(long *)(pdVar12 + iVar9 * 8) + vVar5);
        local_48.lower = *puVar1;
        local_48.upper = puVar1[1];
        bVar14 = (1 << ((byte)col_idx & 7) &
                 (uint)*(byte *)(*(long *)(pdVar12 + iVar9 * 8) + (col_idx >> 3))) != 0;
        if (bVar14) {
          bVar14 = uhugeint_t::operator==((uhugeint_t *)(pdVar4 + iVar11 * 0x10),&local_48);
        }
        if (bVar14 != false) {
          sel->sel_vector[iVar13] = (sel_t)iVar9;
          iVar13 = iVar13 + 1;
        }
        iVar10 = iVar10 + 1;
      } while (count != iVar10);
      return iVar13;
    }
  }
  else if (count != 0) {
    iVar13 = 0;
    iVar10 = 0;
    local_38 = pdVar12;
    do {
      iVar9 = iVar10;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar9 = (idx_t)sel->sel_vector[iVar10];
      }
      psVar6 = pSVar3->sel_vector;
      iVar11 = iVar9;
      if (psVar6 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar6[iVar9];
      }
      puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = (puVar2[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0;
      }
      uVar8 = (uint)*(byte *)(*(long *)(pdVar12 + iVar9 * 8) + (col_idx >> 3)) &
              1 << ((byte)col_idx & 7);
      puVar1 = (uint64_t *)(*(long *)(pdVar12 + iVar9 * 8) + vVar5);
      local_48.lower = *puVar1;
      local_48.upper = puVar1[1];
      if ((bVar14 == false) && (uVar8 != 0)) {
        bVar14 = uhugeint_t::operator==((uhugeint_t *)(pdVar4 + iVar11 * 0x10),&local_48);
        pdVar12 = local_38;
      }
      else {
        bVar14 = (bool)(bVar14 ^ uVar8 == 0 ^ 1);
      }
      if (bVar14 != false) {
        sel->sel_vector[iVar13] = (sel_t)iVar9;
        iVar13 = iVar13 + 1;
      }
      iVar10 = iVar10 + 1;
    } while (count != iVar10);
    return iVar13;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}